

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O3

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  ulong uVar2;
  undefined1 (*pauVar3) [64];
  uint uVar4;
  undefined1 (*pauVar5) [64];
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  
  uVar1 = b->c;
  uVar4 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,(Allocator *)opt);
  iVar6 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        pauVar3 = (undefined1 (*) [64])(b->cstep * uVar2 * b->elemsize + (long)b->data);
        pauVar5 = (undefined1 (*) [64])(c->cstep * uVar2 * c->elemsize + (long)c->data);
        auVar10 = vbroadcastss_avx512f(ZEXT416(*a->data));
        if ((int)uVar4 < 0x10) {
          uVar8 = 0;
        }
        else {
          iVar6 = 0xf;
          do {
            auVar11 = vaddps_avx512f(auVar10,*pauVar3);
            *pauVar5 = auVar11;
            pauVar3 = pauVar3 + 1;
            pauVar5 = pauVar5 + 1;
            iVar6 = iVar6 + 0x10;
            uVar8 = uVar4 & 0xfffffff0;
          } while (iVar6 < (int)uVar4);
        }
        fVar12 = auVar10._0_4_;
        uVar7 = uVar8 | 7;
        while ((int)uVar7 < (int)uVar4) {
          auVar14._0_4_ = fVar12 + *(float *)*pauVar3;
          auVar14._4_4_ = fVar12 + *(float *)(*pauVar3 + 4);
          auVar14._8_4_ = fVar12 + *(float *)(*pauVar3 + 8);
          auVar14._12_4_ = fVar12 + *(float *)(*pauVar3 + 0xc);
          auVar14._16_4_ = fVar12 + *(float *)(*pauVar3 + 0x10);
          auVar14._20_4_ = fVar12 + *(float *)(*pauVar3 + 0x14);
          auVar14._24_4_ = fVar12 + *(float *)(*pauVar3 + 0x18);
          auVar14._28_4_ = fVar12 + *(float *)(*pauVar3 + 0x1c);
          *(undefined1 (*) [32])*pauVar5 = auVar14;
          pauVar3 = (undefined1 (*) [64])(*pauVar3 + 0x20);
          pauVar5 = (undefined1 (*) [64])((long)*pauVar5 + 0x20);
          uVar7 = uVar8 + 0xf;
          uVar8 = uVar8 + 8;
        }
        uVar7 = uVar8 | 3;
        while ((int)uVar7 < (int)uVar4) {
          auVar13._0_4_ = fVar12 + *(float *)*pauVar3;
          auVar13._4_4_ = fVar12 + *(float *)(*pauVar3 + 4);
          auVar13._8_4_ = fVar12 + *(float *)(*pauVar3 + 8);
          auVar13._12_4_ = fVar12 + *(float *)(*pauVar3 + 0xc);
          *(undefined1 (*) [16])*pauVar5 = auVar13;
          pauVar3 = (undefined1 (*) [64])(*pauVar3 + 0x10);
          pauVar5 = (undefined1 (*) [64])((long)*pauVar5 + 0x10);
          uVar7 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if (uVar4 - uVar8 != 0 && (int)uVar8 <= (int)uVar4) {
          lVar9 = 0;
          do {
            *(float *)((long)*pauVar5 + lVar9 * 4) = fVar12 + *(float *)(*pauVar3 + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (uVar4 - uVar8 != (int)lVar9);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != uVar1);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}